

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

Transform * __thiscall pbrt::TransformCache::Lookup(TransformCache *this,Transform *t)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  memory_resource *pmVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  bool bVar20;
  int iVar21;
  uint64_t uVar22;
  undefined4 extraout_var;
  _Hash_node_base *p_Var23;
  ulong uVar24;
  long in_FS_OFFSET;
  Transform *tptr;
  
  *(long *)(in_FS_OFFSET + -0x40) = *(long *)(in_FS_OFFSET + -0x40) + 1;
  if ((this->hashTable)._M_h._M_element_count != 0) {
    uVar22 = Transform::Hash(t);
    uVar1 = (this->hashTable)._M_h._M_bucket_count;
    uVar24 = uVar22 % uVar1;
    p_Var2 = (this->hashTable)._M_h._M_buckets[uVar24];
    p_Var23 = (_Hash_node_base *)0x0;
    if (p_Var2 != (__node_base_ptr)0x0) {
      p_Var23 = p_Var2->_M_nxt;
    }
    while (p_Var23 != (_Hash_node_base *)0x0) {
      bVar20 = SquareMatrix<4>::operator==(&t->m,(SquareMatrix<4> *)p_Var23[1]._M_nxt);
      if (bVar20) {
        *(long *)(in_FS_OFFSET + -0x38) = *(long *)(in_FS_OFFSET + -0x38) + 1;
        return (Transform *)p_Var23[1]._M_nxt;
      }
      p_Var3 = p_Var23->_M_nxt;
      p_Var23 = (_Hash_node_base *)0x0;
      if ((p_Var3 != (_Hash_node_base *)0x0) &&
         (p_Var23 = p_Var3, (ulong)p_Var3[2]._M_nxt % uVar1 != uVar24)) {
        p_Var23 = (_Hash_node_base *)0x0;
      }
    }
  }
  pmVar4 = (this->alloc).memoryResource;
  iVar21 = (*pmVar4->_vptr_memory_resource[2])(pmVar4,0x80,4);
  tptr = (Transform *)CONCAT44(extraout_var,iVar21);
  uVar5 = *(undefined8 *)(t->m).m[0];
  uVar6 = *(undefined8 *)((t->m).m[0] + 2);
  uVar7 = *(undefined8 *)(t->m).m[1];
  uVar8 = *(undefined8 *)((t->m).m[1] + 2);
  uVar9 = *(undefined8 *)(t->m).m[2];
  uVar10 = *(undefined8 *)((t->m).m[2] + 2);
  uVar11 = *(undefined8 *)(t->m).m[3];
  uVar12 = *(undefined8 *)((t->m).m[3] + 2);
  uVar13 = *(undefined8 *)((t->mInv).m[0] + 2);
  uVar14 = *(undefined8 *)(t->mInv).m[1];
  uVar15 = *(undefined8 *)((t->mInv).m[1] + 2);
  uVar16 = *(undefined8 *)(t->mInv).m[2];
  uVar17 = *(undefined8 *)((t->mInv).m[2] + 2);
  uVar18 = *(undefined8 *)(t->mInv).m[3];
  uVar19 = *(undefined8 *)((t->mInv).m[3] + 2);
  *(undefined8 *)(tptr->mInv).m[0] = *(undefined8 *)(t->mInv).m[0];
  *(undefined8 *)((tptr->mInv).m[0] + 2) = uVar13;
  *(undefined8 *)(tptr->mInv).m[1] = uVar14;
  *(undefined8 *)((tptr->mInv).m[1] + 2) = uVar15;
  *(undefined8 *)(tptr->mInv).m[2] = uVar16;
  *(undefined8 *)((tptr->mInv).m[2] + 2) = uVar17;
  *(undefined8 *)(tptr->mInv).m[3] = uVar18;
  *(undefined8 *)((tptr->mInv).m[3] + 2) = uVar19;
  *(undefined8 *)(tptr->m).m[0] = uVar5;
  *(undefined8 *)((tptr->m).m[0] + 2) = uVar6;
  *(undefined8 *)(tptr->m).m[1] = uVar7;
  *(undefined8 *)((tptr->m).m[1] + 2) = uVar8;
  *(undefined8 *)(tptr->m).m[2] = uVar9;
  *(undefined8 *)((tptr->m).m[2] + 2) = uVar10;
  *(undefined8 *)(tptr->m).m[3] = uVar11;
  *(undefined8 *)((tptr->m).m[3] + 2) = uVar12;
  *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + 0x80;
  std::__detail::
  _Insert_base<pbrt::Transform_*,_pbrt::Transform_*,_std::allocator<pbrt::Transform_*>,_std::__detail::_Identity,_std::equal_to<pbrt::Transform_*>,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<pbrt::Transform_*,_pbrt::Transform_*,_std::allocator<pbrt::Transform_*>,_std::__detail::_Identity,_std::equal_to<pbrt::Transform_*>,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&this->hashTable,&tptr);
  return tptr;
}

Assistant:

const Transform *TransformCache::Lookup(const Transform &t) {
    ++nTransformCacheLookups;

    if (!hashTable.empty()) {
        size_t offset = t.Hash() % hashTable.bucket_count();
        for (auto iter = hashTable.begin(offset); iter != hashTable.end(offset); ++iter) {
            if (**iter == t) {
                ++nTransformCacheHits;
                return *iter;
            }
        }
    }
    Transform *tptr = alloc.new_object<Transform>(t);
    transformCacheBytes += sizeof(Transform);
    hashTable.insert(tptr);
    return tptr;
}